

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O3

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue)

{
  undefined1 auVar1 [16];
  char cVar2;
  byte bVar3;
  short sVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  short *psVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  
  uVar15 = 0xb;
  if (tableLog != 0) {
    uVar15 = (ulong)tableLog;
  }
  uVar17 = (uint)uVar15;
  sVar7 = 0xffffffffffffffff;
  if ((4 < uVar17) && (sVar7 = 0xffffffffffffffd4, uVar17 < 0xd)) {
    uVar5 = (int)total - 1;
    uVar10 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    uVar5 = (uVar10 ^ 0xffffffe0) + 0x21;
    uVar10 = 0x1f;
    if (maxSymbolValue != 0) {
      for (; maxSymbolValue >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    uVar10 = (uVar10 ^ 0xffffffe0) + 0x22;
    if (uVar5 < uVar10) {
      uVar10 = uVar5;
    }
    sVar7 = 0xffffffffffffffff;
    if (uVar10 <= uVar17) {
      bVar3 = (byte)uVar15;
      cVar2 = -bVar3;
      bVar8 = cVar2 + 0x3e;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = total;
      iVar12 = 1 << (bVar3 & 0x1f);
      uVar16 = 0;
      uVar6 = 0;
      uVar17 = 0;
      iVar20 = iVar12;
      do {
        uVar14 = (ulong)uVar17;
        uVar13 = (ulong)count[uVar14];
        if (uVar13 == total) {
          return 0;
        }
        uVar10 = (uint)(total >> (bVar3 & 0x3f));
        if (uVar13 == 0) {
          normalizedCounter[uVar14] = 0;
        }
        else if (uVar10 < count[uVar14]) {
          uVar13 = uVar13 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
          uVar19 = uVar13 >> (bVar8 & 0x3f);
          if ((uVar19 & 0xfff8) == 0) {
            uVar19 = (ulong)((int)uVar19 +
                            (uint)((ulong)FSE_normalizeCount::rtbTable[uVar19 & 0xffff] <<
                                   (cVar2 + 0x2aU & 0x3f) <
                                  uVar13 - ((uVar19 & 0xffff) << (bVar8 & 0x3f))));
          }
          uVar9 = (ushort)uVar19;
          if ((ushort)uVar16 < uVar9) {
            uVar6 = uVar14;
          }
          if ((ushort)uVar16 < uVar9) {
            uVar16 = uVar19 & 0xffff;
          }
          normalizedCounter[uVar14] = uVar9;
          iVar20 = iVar20 - (int)(uVar19 & 0xffff);
        }
        else {
          normalizedCounter[uVar14] = -1;
          iVar20 = iVar20 + -1;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 <= maxSymbolValue);
      sVar4 = normalizedCounter[uVar6];
      iVar18 = (int)sVar4 >> 1;
      if (iVar18 == -iVar20 || SBORROW4(iVar18,-iVar20) != iVar18 + iVar20 < 0) {
        uVar13 = total * 3 >> (bVar3 + 1 & 0x3f);
        uVar16 = (ulong)(maxSymbolValue + 1);
        uVar6 = 0;
        uVar17 = 0;
        do {
          uVar5 = count[uVar6];
          if ((ulong)uVar5 == 0) {
            normalizedCounter[uVar6] = 0;
          }
          else {
            if (uVar10 < uVar5) {
              if ((uint)uVar13 < uVar5) {
                normalizedCounter[uVar6] = -2;
                goto LAB_00175228;
              }
              normalizedCounter[uVar6] = 1;
            }
            else {
              normalizedCounter[uVar6] = -1;
            }
            uVar17 = uVar17 + 1;
            total = total - uVar5;
          }
LAB_00175228:
          uVar6 = uVar6 + 1;
        } while (uVar16 != uVar6);
        uVar10 = iVar12 - uVar17;
        uVar6 = (ulong)uVar10;
        if ((uVar13 & 0xffffffff) < total / uVar6) {
          uVar6 = total * 3;
          uVar13 = 0;
          do {
            if ((normalizedCounter[uVar13] == -2) &&
               (uVar5 = count[uVar13], uVar5 <= (uint)(uVar6 / (uVar10 * 2)))) {
              normalizedCounter[uVar13] = 1;
              uVar17 = uVar17 + 1;
              total = total - uVar5;
            }
            uVar13 = uVar13 + 1;
          } while (uVar16 != uVar13);
          uVar6 = (ulong)(iVar12 - uVar17);
        }
        iVar20 = (int)uVar6;
        if (uVar17 != maxSymbolValue + 1) {
          if (total == 0) {
            if (iVar20 == 0) {
              return uVar15;
            }
            uVar16 = 0;
            do {
              if (0 < normalizedCounter[uVar16]) {
                uVar6 = (ulong)((int)uVar6 - 1);
                normalizedCounter[uVar16] = normalizedCounter[uVar16] + 1;
              }
              uVar17 = (uint)uVar16;
              uVar16 = (ulong)(uVar17 + 1);
              if (uVar17 == maxSymbolValue) {
                uVar16 = 0;
              }
            } while ((int)uVar6 != 0);
            return uVar15;
          }
          uVar13 = ~(-1L << (cVar2 + 0x3dU & 0x3f));
          uVar17 = 0;
          uVar16 = uVar13;
          do {
            uVar14 = uVar16;
            if (normalizedCounter[uVar17] == -2) {
              uVar14 = (ulong)count[uVar17] * (((uVar6 << (bVar8 & 0x3f)) + uVar13) / total) +
                       uVar16;
              uVar16 = uVar16 >> (bVar8 & 0x3f);
              uVar19 = uVar14 >> (bVar8 & 0x3f);
              if (uVar19 == uVar16) {
                return 0xffffffffffffffff;
              }
              normalizedCounter[uVar17] = (short)uVar19 - (short)uVar16;
            }
            uVar17 = uVar17 + 1;
            uVar16 = uVar14;
          } while (uVar17 <= maxSymbolValue);
          return uVar15;
        }
        uVar6 = 0;
        uVar13 = 0;
        uVar17 = 0;
        do {
          if (uVar17 < count[uVar6]) {
            uVar13 = uVar6 & 0xffffffff;
            uVar17 = count[uVar6];
          }
          uVar6 = uVar6 + 1;
        } while (uVar16 != uVar6);
        psVar11 = normalizedCounter + uVar13;
        sVar4 = *psVar11;
      }
      else {
        psVar11 = normalizedCounter + uVar6;
      }
      *psVar11 = sVar4 + (short)iVar20;
      sVar7 = uVar15;
    }
  }
  return sVar7;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        U64 const scale = 62 - tableLog;
        U64 const step = ((U64)1<<62) / total;   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = -1;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            printf("%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            printf("Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}